

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clip.cpp
# Opt level: O1

void __thiscall clip_model_loader::alloc_compute_meta(clip_model_loader *this)

{
  int iVar1;
  ggml_backend_buffer_type *pgVar2;
  long lVar3;
  long lVar4;
  ggml_cgraph *pgVar5;
  clip_ctx *pcVar6;
  ulong uVar7;
  undefined8 uVar8;
  pointer ppgVar9;
  clip_image_size load_image_size;
  ulong uVar10;
  undefined1 auVar11 [16];
  clip_image_f32_ptr img;
  clip_image_f32_batch batch;
  _Head_base<0UL,_clip_image_f32_*,_false> local_50;
  clip_image_f32_batch local_48;
  
  pcVar6 = this->ctx_clip;
  iVar1 = pcVar6->max_nodes;
  lVar3 = ggml_tensor_overhead();
  lVar4 = ggml_graph_overhead();
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (&pcVar6->buf_compute_meta,iVar1 * lVar3 + lVar4);
  local_48.entries.
  super__Vector_base<std::unique_ptr<clip_image_f32,_clip_image_f32_deleter>,_std::allocator<std::unique_ptr<clip_image_f32,_clip_image_f32_deleter>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.entries.
  super__Vector_base<std::unique_ptr<clip_image_f32,_clip_image_f32_deleter>,_std::allocator<std::unique_ptr<clip_image_f32,_clip_image_f32_deleter>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.entries.
  super__Vector_base<std::unique_ptr<clip_image_f32,_clip_image_f32_deleter>,_std::allocator<std::unique_ptr<clip_image_f32,_clip_image_f32_deleter>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_50._M_head_impl = (clip_image_f32 *)operator_new(0x20);
  ((local_50._M_head_impl)->buf).super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  ((local_50._M_head_impl)->buf).super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (local_50._M_head_impl)->nx = 0;
  (local_50._M_head_impl)->ny = 0;
  ((local_50._M_head_impl)->buf).super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  iVar1 = (this->ctx_clip->vision_model).hparams.image_size;
  (local_50._M_head_impl)->nx = iVar1;
  (local_50._M_head_impl)->ny = iVar1;
  std::vector<float,_std::allocator<float>_>::resize
            (&(local_50._M_head_impl)->buf,(ulong)(uint)(iVar1 * iVar1 * 3));
  std::
  vector<std::unique_ptr<clip_image_f32,clip_image_f32_deleter>,std::allocator<std::unique_ptr<clip_image_f32,clip_image_f32_deleter>>>
  ::emplace_back<std::unique_ptr<clip_image_f32,clip_image_f32_deleter>>
            ((vector<std::unique_ptr<clip_image_f32,clip_image_f32_deleter>,std::allocator<std::unique_ptr<clip_image_f32,clip_image_f32_deleter>>>
              *)&local_48,(unique_ptr<clip_image_f32,_clip_image_f32_deleter> *)&local_50);
  load_image_size.height = iVar1;
  load_image_size.width = iVar1;
  pgVar5 = clip_image_build_graph(this->ctx_clip,&local_48,load_image_size,false);
  ggml_backend_sched_reserve
            ((this->ctx_clip->sched)._M_t.
             super___uniq_ptr_impl<ggml_backend_sched,_ggml_backend_sched_deleter>._M_t.
             super__Tuple_impl<0UL,_ggml_backend_sched_*,_ggml_backend_sched_deleter>.
             super__Head_base<0UL,_ggml_backend_sched_*,_false>._M_head_impl,pgVar5);
  pcVar6 = this->ctx_clip;
  ppgVar9 = (pcVar6->backend_ptrs).
            super__Vector_base<ggml_backend_*,_std::allocator<ggml_backend_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((pcVar6->backend_ptrs).super__Vector_base<ggml_backend_*,_std::allocator<ggml_backend_*>_>.
      _M_impl.super__Vector_impl_data._M_finish != ppgVar9) {
    uVar10 = 0;
    do {
      pgVar2 = (pcVar6->backend_buft).
               super__Vector_base<ggml_backend_buffer_type_*,_std::allocator<ggml_backend_buffer_type_*>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar10];
      uVar7 = ggml_backend_sched_get_buffer_size
                        ((pcVar6->sched)._M_t.
                         super___uniq_ptr_impl<ggml_backend_sched,_ggml_backend_sched_deleter>._M_t.
                         super__Tuple_impl<0UL,_ggml_backend_sched_*,_ggml_backend_sched_deleter>.
                         super__Head_base<0UL,_ggml_backend_sched_*,_false>._M_head_impl,
                         ppgVar9[uVar10]);
      if ((1 < uVar7) && ((int)g_logger_state.verbosity_thold < 3)) {
        uVar8 = ggml_backend_buft_name(pgVar2);
        auVar11._8_4_ = (int)(uVar7 >> 0x20);
        auVar11._0_8_ = uVar7;
        auVar11._12_4_ = 0x45300000;
        clip_log_internal(GGML_LOG_LEVEL_INFO,"%s: %10s compute buffer size = %8.2f MiB\n",
                          ((auVar11._8_8_ - 1.9342813113834067e+25) +
                          ((double)CONCAT44(0x43300000,(int)uVar7) - 4503599627370496.0)) *
                          0.0009765625 * 0.0009765625,"alloc_compute_meta",uVar8);
      }
      uVar10 = uVar10 + 1;
      pcVar6 = this->ctx_clip;
      ppgVar9 = (pcVar6->backend_ptrs).
                super__Vector_base<ggml_backend_*,_std::allocator<ggml_backend_*>_>._M_impl.
                super__Vector_impl_data._M_start;
    } while (uVar10 < (ulong)((long)(pcVar6->backend_ptrs).
                                    super__Vector_base<ggml_backend_*,_std::allocator<ggml_backend_*>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)ppgVar9 >> 3)
            );
  }
  if (local_50._M_head_impl != (clip_image_f32 *)0x0) {
    clip_image_f32_free(local_50._M_head_impl);
  }
  std::
  vector<std::unique_ptr<clip_image_f32,_clip_image_f32_deleter>,_std::allocator<std::unique_ptr<clip_image_f32,_clip_image_f32_deleter>_>_>
  ::~vector(&local_48.entries);
  return;
}

Assistant:

void alloc_compute_meta() {
        ctx_clip.buf_compute_meta.resize(ctx_clip.max_nodes * ggml_tensor_overhead() + ggml_graph_overhead());

        // create a fake batch
        clip_image_f32_batch batch;
        clip_image_f32_ptr img(clip_image_f32_init());
        clip_image_size image_size;
        image_size.width  = ctx_clip.vision_model.hparams.image_size;
        image_size.height = ctx_clip.vision_model.hparams.image_size;
        img->nx = image_size.width;
        img->ny = image_size.height;
        img->buf.resize(image_size.width * image_size.height * 3);
        batch.entries.push_back(std::move(img));

        ggml_cgraph * gf = clip_image_build_graph(&ctx_clip, batch, image_size, false);
        ggml_backend_sched_reserve(ctx_clip.sched.get(), gf);
        for (size_t i = 0; i < ctx_clip.backend_ptrs.size(); ++i) {
            ggml_backend_t backend = ctx_clip.backend_ptrs[i];
            ggml_backend_buffer_type_t buft = ctx_clip.backend_buft[i];
            size_t size = ggml_backend_sched_get_buffer_size(ctx_clip.sched.get(), backend);
            if (size > 1) {
                LOG_INF("%s: %10s compute buffer size = %8.2f MiB\n", __func__,
                        ggml_backend_buft_name(buft),
                        size / 1024.0 / 1024.0);
            }
        }
    }